

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

string * __thiscall
kratos::EventControl::to_string
          (string *__return_storage_ptr__,EventControl *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
          *var_str)

{
  EventEdgeType EVar1;
  InternalException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (this->type == Edge) {
    EVar1 = this->edge;
    local_48._M_dataplus._M_p = (pointer)this->var;
    if ((var_str->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*var_str->_M_invoker)(&local_68,(_Any_data *)var_str,(Var **)&local_48);
    local_48._M_dataplus._M_p = "negedge";
    if (EVar1 == Posedge) {
      local_48._M_dataplus._M_p = "posedge";
    }
    local_48.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
    local_48.field_2._8_8_ = local_68._M_string_length;
    format_str_00.size_ = 0xdc;
    format_str_00.data_ = (char *)0x7;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)"{0} {1}",format_str_00,args_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (this->type != Delay) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unrecognized event control type","");
      InternalException::InternalException(this_00,&local_48);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p = (pointer)this->delay;
    format_str.size_ = 4;
    format_str.data_ = (char *)0x4;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)0x2449f3,format_str,args);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EventControl::to_string(const std::function<std::string(const Var *)> &var_str) const {
    switch (type) {
        case EventControlType::Delay: {
            return ::format("#{0}", delay);
        }
        case EventControlType::Edge: {
            return ::format("{0} {1}", edge == EventEdgeType::Posedge ? "posedge" : "negedge",
                            var_str(var));
        }
    }
    throw InternalException("Unrecognized event control type");
}